

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void Catch::anon_unknown_26::hexEscapeChar(ostream *os,uchar c)

{
  _Setfill<char> _Var1;
  fmtflags __fmtfl;
  _Setw _Var2;
  ostream *poVar3;
  void *this;
  undefined8 uVar4;
  byte in_SIL;
  ostream *in_RDI;
  fmtflags f;
  
  __fmtfl = std::ios_base::flags((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  poVar3 = std::operator<<(in_RDI,"\\x");
  this = (void *)std::ostream::operator<<(poVar3,std::uppercase);
  uVar4 = std::ostream::operator<<(this,std::hex);
  _Var1 = std::setfill<char>('0');
  poVar3 = std::operator<<(uVar4,_Var1._M_c);
  _Var2 = std::setw(2);
  poVar3 = std::operator<<(poVar3,_Var2);
  std::ostream::operator<<(poVar3,(uint)in_SIL);
  std::ios_base::flags((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)),__fmtfl);
  return;
}

Assistant:

void hexEscapeChar(std::ostream& os, unsigned char c) {
        std::ios_base::fmtflags f(os.flags());
        os << "\\x"
            << std::uppercase << std::hex << std::setfill('0') << std::setw(2)
            << static_cast<int>(c);
        os.flags(f);
    }